

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int searchvar(FuncState *fs,TString *n)

{
  LocVar *pLVar1;
  uint local_24;
  int i;
  TString *n_local;
  FuncState *fs_local;
  
  local_24 = (uint)fs->nactvar;
  do {
    local_24 = local_24 - 1;
    if ((int)local_24 < 0) {
      return -1;
    }
    pLVar1 = getlocvar(fs,local_24);
  } while (n != pLVar1->varname);
  return local_24;
}

Assistant:

static int searchvar (FuncState *fs, TString *n, expdesc *var) {
  int i;
  for (i = cast_int(fs->nactvar) - 1; i >= 0; i--) {
    Vardesc *vd = getlocalvardesc(fs, i);
    if (eqstr(n, vd->vd.name)) {  /* found? */
      if (vd->vd.kind == RDKCTC)  /* compile-time constant? */
        init_exp(var, VCONST, fs->firstlocal + i);
      else  /* real variable */
        init_var(fs, var, i);
      return var->k;
    }
  }
  return -1;  /* not found */
}